

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

void JSONWorker::DoArray(internalJSONNode *parent,json_string *value_t)

{
  json_string *pjVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  json_string *pjVar6;
  allocator local_131;
  json_string local_130;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  char *local_108;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined4 local_f0;
  allocator local_e9;
  json_string local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  char *local_c0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  size_t local_a8;
  size_t ending;
  size_t starting;
  json_string newValue;
  json_string local_70;
  allocator local_39;
  json_string local_38;
  json_string *local_18;
  json_string *value_t_local;
  internalJSONNode *parent_local;
  
  local_18 = value_t;
  value_t_local = (json_string *)parent;
  bVar2 = std::__cxx11::string::empty();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"DoArray is empty",&local_39);
  JSONDebug::_JSON_ASSERT((bool)((bVar2 ^ 1) & 1),&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
  if (*pcVar3 == '[') {
    uVar4 = std::__cxx11::string::length();
    if (2 < uVar4) {
      std::__cxx11::string::string((string *)&starting);
      ending = 1;
      local_a8 = FindNextRelevant<(char)44>(local_18,1);
      while (local_a8 != 0xffffffffffffffff) {
        local_b8._M_current = (char *)std::__cxx11::string::begin();
        local_b0 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_b8,ending);
        local_c8._M_current = (char *)std::__cxx11::string::begin();
        local_c0 = (char *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator+(&local_c8,local_a8);
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&starting,local_b0,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_c0);
        sVar5 = FindNextRelevant<(char)58>((json_string *)&starting,0);
        pjVar1 = value_t_local;
        if (sVar5 != 0xffffffffffffffff) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_e8,"Key/Value pairs are not allowed in arrays",&local_e9);
          JSONDebug::_JSON_FAIL(&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_e9);
          internalJSONNode::Nullify((internalJSONNode *)value_t_local);
          local_f0 = 1;
          goto LAB_0012bd34;
        }
        pjVar6 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
        NewNode((internalJSONNode *)pjVar1,pjVar6,(json_string *)&starting,true);
        ending = local_a8 + 1;
        local_a8 = FindNextRelevant<(char)44>(local_18,ending);
      }
      local_100._M_current = (char *)std::__cxx11::string::begin();
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_100,ending);
      local_110._M_current = (char *)std::__cxx11::string::end();
      local_108 = (char *)__gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator-(&local_110,1);
      std::__cxx11::string::
      assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&starting,local_f8,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )local_108);
      sVar5 = FindNextRelevant<(char)58>((json_string *)&starting,0);
      pjVar1 = value_t_local;
      if (sVar5 == 0xffffffffffffffff) {
        pjVar6 = jsonSingletonEMPTY_JSON_STRING::getValue_abi_cxx11_();
        NewNode((internalJSONNode *)pjVar1,pjVar6,(json_string *)&starting,true);
        local_f0 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_130,"Key/Value pairs are not allowed in arrays",&local_131);
        JSONDebug::_JSON_FAIL(&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        internalJSONNode::Nullify((internalJSONNode *)value_t_local);
        local_f0 = 1;
      }
LAB_0012bd34:
      std::__cxx11::string::~string((string *)&starting);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"DoArray is not an array",
               (allocator *)(newValue.field_2._M_local_buf + 0xf));
    JSONDebug::_JSON_FAIL(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)(newValue.field_2._M_local_buf + 0xf));
    internalJSONNode::Nullify((internalJSONNode *)value_t_local);
  }
  return;
}

Assistant:

void JSONWorker::DoArray(const internalJSONNode * parent, const json_string & value_t) json_nothrow {
	//This takes an array and creates nodes out of them
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoArray is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('['), JSON_TEXT("DoArray is not an array"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a [] (blank array)
	
	#ifdef JSON_SAFE
		json_string newValue;  //share this so it has a reserved buffer
	#endif
	size_t starting = 1;  //ignore the [
	
	//Not sure what's in the array, so we have to use commas
	for(size_t ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, 1);
		ending != json_string::npos;
		ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, starting)){
		
		#ifdef JSON_SAFE
			newValue.assign(value_t.begin() + starting, value_t.begin() + ending);
			JSON_ASSERT_SAFE(FIND_NEXT_RELEVANT(JSON_TEXT(':'), newValue, 0) == json_string::npos, JSON_TEXT("Key/Value pairs are not allowed in arrays"), parent -> Nullify(); return;);
			NewNode(parent, json_global(EMPTY_JSON_STRING), newValue, true);
		#else
			NewNode(parent, json_global(EMPTY_JSON_STRING), json_string(value_t.begin() + starting, value_t.begin() + ending), true);
		#endif
		starting = ending + 1;
	}
	//since the last one will not find the comma, we have to add it here, but ignore the final ]
	
	#ifdef JSON_SAFE
		newValue.assign(value_t.begin() + starting, value_t.end() - 1);
		JSON_ASSERT_SAFE(FIND_NEXT_RELEVANT(JSON_TEXT(':'), newValue, 0) == json_string::npos, JSON_TEXT("Key/Value pairs are not allowed in arrays"), parent -> Nullify(); return;);
		NewNode(parent, json_global(EMPTY_JSON_STRING), newValue, true);
	#else
		NewNode(parent, json_global(EMPTY_JSON_STRING), json_string(value_t.begin() + starting, value_t.end() - 1), true);
	#endif
}